

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O1

string * __thiscall
dynamicgraph::SignalBase<int>::shortName_abi_cxx11_
          (string *__return_storage_ptr__,SignalBase<int> *this)

{
  size_t sVar1;
  char buffer [128];
  istringstream iss;
  char acStack_218 [128];
  long local_198 [4];
  int aiStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_198,(string *)&this->name,_S_in)
  ;
  while (*(int *)((long)aiStack_178 + *(long *)(local_198[0] + -0x18)) == 0) {
    std::istream::getline((char *)local_198,(long)acStack_218,-0x80);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_218);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_218,acStack_218 + sVar1);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string shortName() const {
    std::istringstream iss(name);
    const int SIZE = 128;
    char buffer[SIZE];
    while (iss.good()) {
      iss.getline(buffer, SIZE, ':');
    }
    const std::string res(buffer);
    return res;
  }